

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_tostring.hpp
# Opt level: O2

string * __thiscall
Catch::Detail::
rangeToString<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>>
          (string *__return_storage_ptr__,Detail *this,
          __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> first,
          __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> last)

{
  Detail *e;
  ReusableStringStream rss;
  ReusableStringStream RStack_58;
  string local_48;
  
  ReusableStringStream::ReusableStringStream(&RStack_58);
  std::operator<<(RStack_58.m_oss,"{ ");
  if (this != (Detail *)first._M_current) {
    stringify<double>(&local_48,(double *)this);
    std::operator<<(RStack_58.m_oss,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    for (e = this + 8; e != (Detail *)first._M_current; e = e + 8) {
      std::operator<<(RStack_58.m_oss,", ");
      stringify<double>(&local_48,(double *)e);
      std::operator<<(RStack_58.m_oss,(string *)&local_48);
      std::__cxx11::string::~string((string *)&local_48);
    }
  }
  std::operator<<(RStack_58.m_oss," }");
  ReusableStringStream::str_abi_cxx11_(__return_storage_ptr__,&RStack_58);
  ReusableStringStream::~ReusableStringStream(&RStack_58);
  return __return_storage_ptr__;
}

Assistant:

std::string rangeToString(InputIterator first, Sentinel last) {
            ReusableStringStream rss;
            rss << "{ ";
            if (first != last) {
                rss << ::Catch::Detail::stringify(*first);
                for (++first; first != last; ++first)
                    rss << ", " << ::Catch::Detail::stringify(*first);
            }
            rss << " }";
            return rss.str();
        }